

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void eye(double *mat,int N)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    pdVar3 = mat;
    do {
      uVar4 = 0;
      do {
        if (uVar2 == uVar4) {
          mat[uVar2 + uVar2 * uVar1] = 1.0;
        }
        else {
          pdVar3[uVar4] = 0.0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + uVar1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void eye(double *mat,int N) {
	int i,j,t;
	for(i = 0;i < N;++i) {
		for(j =0; j < N;++j) {
			t = i*N;
			if (i == j) {
				mat[t+j] = 1.;
			} else {
				mat[t+j] = 0.;
			}
		}
		
	}
}